

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box.hpp
# Opt level: O0

void __thiscall
pico_tree::internal::box_base<pico_tree::internal::box<double,_2UL>_>::max_side
          (box_base<pico_tree::internal::box<double,_2UL>_> *this,size_type *p_max_index,
          scalar_type *p_max_value)

{
  box<double,_2UL> *this_00;
  size_type sVar1;
  scalar_type *psVar2;
  double *in_RDX;
  ulong *in_RSI;
  box_base<pico_tree::internal::box<double,_2UL>_> *in_RDI;
  double dVar3;
  scalar_type delta;
  size_type i;
  size_type in_stack_ffffffffffffffb8;
  box_base<pico_tree::internal::box<double,_2UL>_> *in_stack_ffffffffffffffc0;
  undefined8 local_20;
  
  dVar3 = std::numeric_limits<double>::lowest();
  *in_RDX = dVar3;
  local_20 = 0;
  while( true ) {
    this_00 = derived(in_RDI);
    sVar1 = box<double,_2UL>::size(this_00);
    if (sVar1 <= local_20) break;
    psVar2 = max(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    in_stack_ffffffffffffffc0 = (box_base<pico_tree::internal::box<double,_2UL>_> *)*psVar2;
    psVar2 = min(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    dVar3 = (double)in_stack_ffffffffffffffc0 - *psVar2;
    if (*in_RDX <= dVar3 && dVar3 != *in_RDX) {
      *in_RSI = local_20;
      *in_RDX = dVar3;
    }
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

constexpr void max_side(
      size_type& p_max_index, scalar_type& p_max_value) const {
    p_max_value = std::numeric_limits<scalar_type>::lowest();

    for (size_type i = 0; i < derived().size(); ++i) {
      scalar_type const delta = max(i) - min(i);
      if (delta > p_max_value) {
        p_max_index = i;
        p_max_value = delta;
      }
    }
  }